

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O3

void standard_ok_method_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object window;
  Am_Object widget;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value local_20;
  
  pAVar2 = Am_Object::Get(cmd,0x170,0);
  Am_Object::Am_Object(&local_28,pAVar2);
  bVar1 = Am_Object::Valid(&local_28);
  if (!bVar1) {
    Am_Error("Lost widget");
  }
  pAVar2 = Am_Object::Get(&local_28,0x68,0);
  Am_Object::Am_Object(&AStack_38,pAVar2);
  bVar1 = Am_Object::Valid(&AStack_38);
  if (bVar1) {
    pAVar2 = Am_Object::Get(cmd,0x169,0);
    Am_Object::Am_Object(&local_30,&AStack_38);
    Am_Value::Am_Value(&local_20,pAVar2);
    Am_Finish_Pop_Up_Waiting(&local_30,&local_20);
    Am_Value::~Am_Value(&local_20);
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&AStack_38);
    Am_Object::~Am_Object(&local_28);
    return;
  }
  Am_Error("Lost window");
}

Assistant:

Am_Define_Method(Am_Object_Method, void, standard_ok_method, (Am_Object cmd))
{
  Am_Object widget = cmd.Get(Am_SAVED_OLD_OWNER);
  if (!widget.Valid())
    Am_Error("Lost widget");
  Am_Object window = widget.Get(Am_WINDOW);
  if (!window.Valid())
    Am_Error("Lost window");
  const Am_Value& v = cmd.Get(Am_VALUE);
  Am_Finish_Pop_Up_Waiting(window, v);
}